

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.cpp
# Opt level: O3

Child * __thiscall Archive::Child::getNext(Child *__return_storage_ptr__,Child *this,bool *error)

{
  Buffer *pBVar1;
  pointer pcVar2;
  
  pBVar1 = this->parent->data;
  pcVar2 = (pBVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  if ((ulong)((long)(this->data + ((this->len & 1) + this->len)) - (long)pcVar2) <
      (ulong)((long)(pBVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pcVar2)) {
    Child(__return_storage_ptr__,this->parent,this->data + ((this->len & 1) + this->len),error);
  }
  else {
    __return_storage_ptr__->parent = (Archive *)0x0;
    __return_storage_ptr__->data = (uint8_t *)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->data + 6) = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

Archive::Child Archive::Child::getNext(bool& error) const {
  // Members are aligned to even byte boundaries.
  uint32_t nextOffset = len + (len & 1);
  if ((size_t)(data - (const uint8_t*)parent->data.data() + nextOffset) >=
      parent->data.size()) { // End of the archive.
    return Child();
  }
  return Child(parent, data + nextOffset, &error);
}